

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O3

int hash_step(gost_ctx *c,byte *H,byte *M)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined2 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined2 uVar14;
  byte bVar15;
  byte bVar16;
  undefined2 uVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  int iVar21;
  long lVar22;
  byte *pbVar23;
  undefined8 *puVar24;
  byte bVar25;
  int i_1;
  long lVar26;
  ushort uVar27;
  undefined1 auVar28 [16];
  byte S [32];
  byte V [32];
  byte U [32];
  byte W [32];
  byte Key [32];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined2 local_e8;
  undefined6 uStack_e6;
  byte local_e0;
  byte bStack_df;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  byte bStack_da;
  byte bStack_d9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  ulong local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  byte local_78 [48];
  undefined1 local_48 [16];
  
  lVar22 = 0;
  do {
    uVar8 = *(ulong *)((long)(H + lVar22) + 8);
    uVar9 = *(ulong *)((long)(M + lVar22) + 8);
    *(ulong *)((long)&local_98 + lVar22) = *(ulong *)(M + lVar22) ^ *(ulong *)(H + lVar22);
    *(ulong *)((long)&uStack_90 + lVar22) = uVar9 ^ uVar8;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x20);
  pbVar23 = local_78;
  puVar24 = &local_98;
  lVar22 = 0;
  do {
    lVar26 = 0;
    do {
      pbVar23[lVar26 * 4] = *(byte *)((long)puVar24 + lVar26);
      lVar26 = lVar26 + 1;
    } while (lVar26 != 8);
    lVar22 = lVar22 + 1;
    pbVar23 = pbVar23 + 1;
    puVar24 = puVar24 + 1;
  } while (lVar22 != 4);
  pbVar23 = local_78;
  gost_enc_with_key(c,pbVar23,H,(byte *)&local_f8);
  local_b8 = *(ulong *)(H + 8);
  uStack_b0 = *(ulong *)(H + 0x10);
  local_a8 = *(undefined8 *)(H + 0x18);
  local_a0 = *(ulong *)H ^ *(ulong *)(H + 8);
  local_d8 = *(ulong *)(M + 0x10);
  uStack_d0 = *(ulong *)(M + 0x18);
  local_c8 = *(ulong *)M ^ *(ulong *)(M + 8);
  local_c0 = *(ulong *)(M + 8) ^ *(ulong *)(M + 0x10);
  lVar22 = 0;
  do {
    uVar2 = *(uint *)((long)&local_d8 + lVar22 + 4);
    uVar3 = *(uint *)((long)&uStack_d0 + lVar22);
    uVar4 = *(uint *)((long)&uStack_d0 + lVar22 + 4);
    uVar5 = *(uint *)((long)&local_b8 + lVar22 + 4);
    uVar6 = *(uint *)((long)&uStack_b0 + lVar22);
    uVar7 = *(uint *)((long)&uStack_b0 + lVar22 + 4);
    *(uint *)((long)&local_98 + lVar22) =
         *(uint *)((long)&local_d8 + lVar22) ^ *(uint *)((long)&local_b8 + lVar22);
    *(uint *)((long)&local_98 + lVar22 + 4) = uVar2 ^ uVar5;
    *(uint *)((long)&uStack_90 + lVar22) = uVar3 ^ uVar6;
    *(uint *)((long)&uStack_90 + lVar22 + 4) = uVar4 ^ uVar7;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x20);
  puVar24 = &local_98;
  lVar22 = 0;
  do {
    lVar26 = 0;
    do {
      pbVar23[lVar26 * 4] = *(byte *)((long)puVar24 + lVar26);
      lVar26 = lVar26 + 1;
    } while (lVar26 != 8);
    lVar22 = lVar22 + 1;
    pbVar23 = pbVar23 + 1;
    puVar24 = puVar24 + 1;
  } while (lVar22 != 4);
  pbVar23 = local_78;
  gost_enc_with_key(c,pbVar23,H + 8,(byte *)&uStack_f0);
  uVar19 = local_a0;
  uVar13 = local_a8;
  uVar18 = uStack_b0;
  uVar9 = local_c8;
  uVar8 = uStack_d0;
  local_b8 = local_b8 ^ uStack_b0;
  local_a0._7_1_ = (byte)(local_b8 >> 0x38);
  local_a0 = CONCAT17(~local_a0._7_1_,(int7)local_b8);
  uVar12 = local_a0;
  local_a0._5_1_ = (byte)(local_b8 >> 0x28);
  local_a0._6_2_ = SUB82(uVar12,6);
  local_a0._4_1_ = (byte)(local_b8 >> 0x20);
  local_a0._4_1_ = ~local_a0._4_1_;
  local_a0._0_4_ = (undefined4)local_b8;
  local_a0 = CONCAT35(CONCAT21(local_a0._6_2_,~local_a0._5_1_),
                      CONCAT14(local_a0._4_1_,(undefined4)local_a0));
  uVar12 = local_a0;
  local_a0._0_1_ = (byte)local_b8;
  local_a0 = CONCAT71(SUB87(uVar12,1),~(byte)local_a0);
  local_a8._7_1_ = (byte)(uVar19 >> 0x38);
  local_a8 = CONCAT17(~local_a8._7_1_,(int7)uVar19);
  uVar12 = local_a8;
  local_a8._4_1_ = (byte)(uVar19 >> 0x20);
  local_a8._4_1_ = ~local_a8._4_1_;
  local_a8._5_3_ = SUB83(uVar12,5);
  local_a8._0_4_ = (undefined4)uVar19;
  uVar12 = local_a8;
  local_a8._2_1_ = (byte)(uVar19 >> 0x10);
  local_a8._3_5_ = SUB85(uVar12,3);
  local_a8._1_1_ = (byte)(uVar19 >> 8);
  local_a8._1_1_ = ~local_a8._1_1_;
  local_a8._0_1_ = (undefined1)uVar19;
  local_a8 = CONCAT62(CONCAT51(local_a8._3_5_,~local_a8._2_1_),
                      CONCAT11(local_a8._1_1_,(undefined1)local_a8));
  uStack_b0._6_1_ = (byte)((ulong)uVar13 >> 0x30);
  uStack_b0._6_1_ = ~uStack_b0._6_1_;
  uStack_b0._7_1_ = (undefined1)((ulong)uVar13 >> 0x38);
  uStack_b0._0_6_ = (undefined6)uVar13;
  uVar12 = uStack_b0;
  uStack_b0._4_1_ = (byte)((ulong)uVar13 >> 0x20);
  uStack_b0._4_1_ = ~uStack_b0._4_1_;
  uStack_b0._5_3_ = SUB83(uVar12,5);
  uStack_b0._0_4_ = (undefined4)uVar13;
  uVar12 = uStack_b0;
  uStack_b0._2_1_ = (byte)((ulong)uVar13 >> 0x10);
  uStack_b0._2_1_ = ~uStack_b0._2_1_;
  uStack_b0._3_5_ = SUB85(uVar12,3);
  uStack_b0._0_2_ = (undefined2)uVar13;
  uVar12 = uStack_b0;
  uStack_b0._0_1_ = (byte)uVar13;
  uStack_b0 = CONCAT71(SUB87(uVar12,1),~(byte)uStack_b0);
  local_b8._7_1_ = (byte)(uVar18 >> 0x38);
  local_b8 = CONCAT17(~local_b8._7_1_,(int7)uVar18);
  uVar12 = local_b8;
  local_b8._5_1_ = (byte)(uVar18 >> 0x28);
  local_b8._5_1_ = ~local_b8._5_1_;
  local_b8._6_2_ = SUB82(uVar12,6);
  local_b8._0_5_ = (undefined5)uVar18;
  uVar12 = local_b8;
  local_b8._3_1_ = (byte)(uVar18 >> 0x18);
  local_b8._3_1_ = ~local_b8._3_1_;
  local_b8._4_4_ = SUB84(uVar12,4);
  local_b8._0_3_ = (undefined3)uVar18;
  uVar12 = local_b8;
  local_b8._1_1_ = (byte)(uVar18 >> 8);
  local_b8._1_1_ = ~local_b8._1_1_;
  local_b8._2_6_ = SUB86(uVar12,2);
  local_b8._0_1_ = (undefined1)uVar18;
  local_c8 = local_d8 ^ uStack_d0;
  local_d8 = uVar9;
  uStack_d0 = local_c0;
  local_c0 = uVar8 ^ uVar9;
  lVar22 = 0;
  do {
    uVar2 = *(uint *)((long)&local_d8 + lVar22 + 4);
    uVar3 = *(uint *)((long)&uStack_d0 + lVar22);
    uVar4 = *(uint *)((long)&uStack_d0 + lVar22 + 4);
    uVar5 = *(uint *)((long)&local_b8 + lVar22 + 4);
    uVar6 = *(uint *)((long)&uStack_b0 + lVar22);
    uVar7 = *(uint *)((long)&uStack_b0 + lVar22 + 4);
    *(uint *)((long)&local_98 + lVar22) =
         *(uint *)((long)&local_d8 + lVar22) ^ *(uint *)((long)&local_b8 + lVar22);
    *(uint *)((long)&local_98 + lVar22 + 4) = uVar2 ^ uVar5;
    *(uint *)((long)&uStack_90 + lVar22) = uVar3 ^ uVar6;
    *(uint *)((long)&uStack_90 + lVar22 + 4) = uVar4 ^ uVar7;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x20);
  puVar24 = &local_98;
  lVar22 = 0;
  do {
    lVar26 = 0;
    do {
      pbVar23[lVar26 * 4] = *(byte *)((long)puVar24 + lVar26);
      lVar26 = lVar26 + 1;
    } while (lVar26 != 8);
    lVar22 = lVar22 + 1;
    pbVar23 = pbVar23 + 1;
    puVar24 = puVar24 + 1;
  } while (lVar22 != 4);
  pbVar23 = local_78;
  gost_enc_with_key(c,pbVar23,H + 0x10,(byte *)&local_e8);
  uVar19 = uStack_b0;
  uVar18 = local_b8;
  uVar9 = local_c8;
  uVar8 = uStack_d0;
  local_b8 = uStack_b0;
  uStack_b0 = local_a8;
  local_a8 = local_a0;
  local_a0 = uVar18 ^ uVar19;
  local_c8 = local_d8 ^ uStack_d0;
  local_d8 = uVar9;
  uStack_d0 = local_c0;
  local_c0 = uVar8 ^ uVar9;
  lVar22 = 0;
  do {
    uVar2 = *(uint *)((long)&local_d8 + lVar22 + 4);
    uVar3 = *(uint *)((long)&uStack_d0 + lVar22);
    uVar4 = *(uint *)((long)&uStack_d0 + lVar22 + 4);
    uVar5 = *(uint *)((long)&local_b8 + lVar22 + 4);
    uVar6 = *(uint *)((long)&uStack_b0 + lVar22);
    uVar7 = *(uint *)((long)&uStack_b0 + lVar22 + 4);
    *(uint *)((long)&local_98 + lVar22) =
         *(uint *)((long)&local_d8 + lVar22) ^ *(uint *)((long)&local_b8 + lVar22);
    *(uint *)((long)&local_98 + lVar22 + 4) = uVar2 ^ uVar5;
    *(uint *)((long)&uStack_90 + lVar22) = uVar3 ^ uVar6;
    *(uint *)((long)&uStack_90 + lVar22 + 4) = uVar4 ^ uVar7;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x20);
  puVar24 = &local_98;
  lVar22 = 0;
  do {
    lVar26 = 0;
    do {
      pbVar23[lVar26 * 4] = *(byte *)((long)puVar24 + lVar26);
      lVar26 = lVar26 + 1;
    } while (lVar26 != 8);
    lVar22 = lVar22 + 1;
    pbVar23 = pbVar23 + 1;
    puVar24 = puVar24 + 1;
  } while (lVar22 != 4);
  gost_enc_with_key(c,local_78,H + 0x18,&local_e0);
  local_48 = ZEXT216(CONCAT11(bStack_d9,bStack_da));
  iVar21 = 0xc;
  do {
    uVar14 = uStack_dc;
    auVar10[1] = local_f8._1_1_;
    auVar10[0] = (byte)local_f8;
    auVar10[2] = local_f8._2_1_;
    auVar10[3] = local_f8._3_1_;
    auVar10[4] = local_f8._4_1_;
    auVar10[5] = local_f8._5_1_;
    auVar10[6] = local_f8._6_1_;
    auVar10[7] = local_f8._7_1_;
    auVar10._8_2_ = (undefined2)uStack_f0;
    auVar10._10_6_ = uStack_f0._2_6_;
    auVar28[1] = bStack_df;
    auVar28[0] = local_e0;
    auVar28._2_2_ = uStack_de;
    auVar28._4_2_ = uStack_dc;
    auVar28[6] = bStack_da;
    auVar28[7] = bStack_d9;
    auVar28._8_8_ = 0;
    local_48 = auVar28 ^ ZEXT416((uint)CONCAT11(local_f8._7_1_,local_f8._6_1_) ^
                                 CONCAT13(local_f8._7_1_,
                                          CONCAT12(local_f8._6_1_,
                                                   CONCAT11(local_f8._5_1_,local_f8._4_1_)))) ^
               local_48 ^ ZEXT216(CONCAT11(local_f8._3_1_,local_f8._2_1_)) ^ auVar10;
    uVar12 = CONCAT26(local_e8,uStack_f0._2_6_);
    uVar13 = CONCAT17(bStack_df,CONCAT16(local_e0,uStack_e6));
    uStack_dc = CONCAT11(bStack_d9,bStack_da);
    local_e0 = (byte)uStack_de;
    bStack_df = (byte)((ushort)uStack_de >> 8);
    uStack_de = uVar14;
    local_e8 = (undefined2)uStack_e6;
    uStack_e6 = (undefined6)((ulong)uVar13 >> 0x10);
    local_f8._0_1_ = local_f8._2_1_;
    local_f8._1_1_ = local_f8._3_1_;
    local_f8._2_1_ = local_f8._4_1_;
    local_f8._3_1_ = local_f8._5_1_;
    local_f8._4_1_ = local_f8._6_1_;
    local_f8._5_1_ = local_f8._7_1_;
    local_f8._6_1_ = (byte)(undefined2)uStack_f0;
    local_f8._7_1_ = (byte)((ushort)(undefined2)uStack_f0 >> 8);
    uStack_f0._0_2_ = (undefined2)uStack_f0._2_6_;
    uStack_f0._2_6_ = (undefined6)((ulong)uVar12 >> 0x10);
    bStack_da = local_48[0];
    bStack_d9 = local_48[1];
    iVar21 = iVar21 + -1;
  } while (iVar21 != 0);
  lVar22 = 0;
  do {
    uVar8 = *(ulong *)((long)(M + lVar22) + 8);
    *(ulong *)((long)&local_f8 + lVar22) =
         *(ulong *)(M + lVar22) ^ *(ulong *)((long)&local_f8 + lVar22);
    *(ulong *)((long)&uStack_f0 + lVar22) = uVar8 ^ *(ulong *)((long)&uStack_f0 + lVar22);
    uVar14 = uStack_dc;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x20);
  bVar20 = local_f8._2_1_ ^ (byte)local_f8 ^ local_f8._4_1_ ^ local_f8._6_1_ ^ local_e0;
  bVar25 = local_f8._3_1_ ^ local_f8._1_1_ ^ local_f8._5_1_ ^ local_f8._7_1_ ^ bStack_df;
  uVar12 = CONCAT26(local_e8,uStack_f0._2_6_);
  uStack_dc = CONCAT11(bStack_d9,bStack_da);
  local_e8 = (undefined2)uStack_e6;
  uStack_e6 = (undefined6)(CONCAT17(bStack_df,CONCAT16(local_e0,uStack_e6)) >> 0x10);
  local_f8._0_1_ = local_f8._2_1_;
  local_f8._1_1_ = local_f8._3_1_;
  local_f8._2_1_ = local_f8._4_1_;
  local_f8._3_1_ = local_f8._5_1_;
  local_f8._4_1_ = local_f8._6_1_;
  local_f8._5_1_ = local_f8._7_1_;
  local_f8._6_1_ = (byte)(undefined2)uStack_f0;
  local_f8._7_1_ = (byte)((ushort)(undefined2)uStack_f0 >> 8);
  uStack_f0._0_2_ = (undefined2)uStack_f0._2_6_;
  uStack_f0._2_6_ = (undefined6)((ulong)uVar12 >> 0x10);
  local_e0 = (byte)uStack_de;
  bStack_df = (byte)((ushort)uStack_de >> 8);
  uStack_de = uVar14;
  bStack_da = bStack_da ^ bVar20;
  bStack_d9 = bStack_d9 ^ bVar25;
  lVar22 = 0;
  do {
    puVar1 = (uint *)(H + lVar22);
    uVar2 = puVar1[1];
    uVar3 = puVar1[2];
    uVar4 = puVar1[3];
    uVar5 = *(uint *)((long)&uStack_f0 + lVar22);
    uVar6 = *(uint *)((long)&uStack_f0 + lVar22 + 4);
    *(uint *)((long)&local_f8 + lVar22) = *puVar1 ^ *(uint *)((long)&local_f8 + lVar22);
    *(uint *)((long)&local_f8 + lVar22 + 4) = uVar2 ^ *(uint *)((long)&local_f8 + lVar22 + 4);
    *(uint *)((long)&uStack_f0 + lVar22) = uVar3 ^ uVar5;
    *(uint *)((long)&uStack_f0 + lVar22 + 4) = uVar4 ^ uVar6;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x20);
  uVar27 = CONCAT11(bStack_d9,bStack_da);
  iVar21 = 0x3d;
  uVar14 = uStack_dc;
  do {
    uStack_dc = uVar14;
    uVar17 = uStack_de;
    bVar16 = local_f8._7_1_;
    bVar15 = local_f8._6_1_;
    bVar25 = local_f8._5_1_;
    bVar20 = local_f8._4_1_;
    uVar27 = CONCAT11(bStack_df,local_e0) ^
             CONCAT11(local_f8._7_1_,local_f8._6_1_) ^ CONCAT11(local_f8._5_1_,local_f8._4_1_) ^
             uVar27 ^ CONCAT11(local_f8._3_1_,local_f8._2_1_) ^
                      CONCAT11(local_f8._1_1_,(byte)local_f8);
    uVar11 = CONCAT11(local_f8._3_1_,local_f8._2_1_);
    uVar12 = CONCAT26(local_e8,uStack_f0._2_6_);
    uVar13 = CONCAT17(bStack_df,CONCAT16(local_e0,uStack_e6));
    uVar14 = CONCAT11(bStack_d9,bStack_da);
    local_e0 = (byte)uStack_de;
    bStack_df = (byte)((ushort)uStack_de >> 8);
    uStack_de = uStack_dc;
    local_e8 = (undefined2)uStack_e6;
    uStack_e6 = (undefined6)((ulong)uVar13 >> 0x10);
    local_f8._0_1_ = local_f8._2_1_;
    local_f8._1_1_ = local_f8._3_1_;
    local_f8._2_1_ = local_f8._4_1_;
    local_f8._3_1_ = local_f8._5_1_;
    local_f8._4_1_ = local_f8._6_1_;
    local_f8._5_1_ = local_f8._7_1_;
    local_f8._6_1_ = (byte)(undefined2)uStack_f0;
    local_f8._7_1_ = (byte)((ushort)(undefined2)uStack_f0 >> 8);
    uStack_f0._0_2_ = (undefined2)uStack_f0._2_6_;
    uStack_f0._2_6_ = (undefined6)((ulong)uVar12 >> 0x10);
    bStack_da = (byte)uVar27;
    bStack_d9 = (byte)(uVar27 >> 8);
    iVar21 = iVar21 + -1;
  } while (iVar21 != 0);
  *(ulong *)(H + 0x10) = CONCAT62(uStack_e6,local_e8);
  *(uint *)(H + 0x18) = CONCAT22(uStack_dc,uVar17);
  *(undefined2 *)(H + 0x1c) = uVar14;
  *(ushort *)(H + 0x1e) = uVar27;
  *(ulong *)H = CONCAT17(local_f8._7_1_,
                         CONCAT16(local_f8._6_1_,
                                  CONCAT15(bVar16,CONCAT14(bVar15,CONCAT13(bVar25,CONCAT12(bVar20,
                                                  uVar11))))));
  *(ulong *)(H + 8) = CONCAT62(uStack_f0._2_6_,(undefined2)uStack_f0);
  return (int)uVar27;
}

Assistant:

static int hash_step(gost_ctx * c, byte * H, const byte * M)
{
    byte U[32], W[32], V[32], S[32], Key[32];
    int i;
    /* Compute first key */
    xor_blocks(W, H, M, 32);
    swap_bytes(W, Key);
    /* Encrypt first 8 bytes of H with first key */
    gost_enc_with_key(c, Key, H, S);
    /* Compute second key */
    circle_xor8(H, U);
    circle_xor8(M, V);
    circle_xor8(V, V);
    xor_blocks(W, U, V, 32);
    swap_bytes(W, Key);
    /* encrypt second 8 bytes of H with second key */
    gost_enc_with_key(c, Key, H + 8, S + 8);
    /* compute third key */
    circle_xor8(U, U);
    U[31] = ~U[31];
    U[29] = ~U[29];
    U[28] = ~U[28];
    U[24] = ~U[24];
    U[23] = ~U[23];
    U[20] = ~U[20];
    U[18] = ~U[18];
    U[17] = ~U[17];
    U[14] = ~U[14];
    U[12] = ~U[12];
    U[10] = ~U[10];
    U[8] = ~U[8];
    U[7] = ~U[7];
    U[5] = ~U[5];
    U[3] = ~U[3];
    U[1] = ~U[1];
    circle_xor8(V, V);
    circle_xor8(V, V);
    xor_blocks(W, U, V, 32);
    swap_bytes(W, Key);
    /* encrypt third 8 bytes of H with third key */
    gost_enc_with_key(c, Key, H + 16, S + 16);
    /* Compute fourth key */
    circle_xor8(U, U);
    circle_xor8(V, V);
    circle_xor8(V, V);
    xor_blocks(W, U, V, 32);
    swap_bytes(W, Key);
    /* Encrypt last 8 bytes with fourth key */
    gost_enc_with_key(c, Key, H + 24, S + 24);
    for (i = 0; i < 12; i++)
        transform_3(S);
    xor_blocks(S, S, M, 32);
    transform_3(S);
    xor_blocks(S, S, H, 32);
    for (i = 0; i < 61; i++)
        transform_3(S);
    memcpy(H, S, 32);
    return 1;
}